

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

void __thiscall
CLI::IncorrectConstruction::IncorrectConstruction(IncorrectConstruction *this,string *msg)

{
  pointer pcVar1;
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"IncorrectConstruction","");
  pcVar1 = (msg->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + msg->_M_string_length);
  IncorrectConstruction(this,&local_40,&local_60,IncorrectConstruction);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

static IncorrectConstruction PositionalFlag(std::string name) {
        return IncorrectConstruction(name + ": Flags cannot be positional");
    }